

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

bool tinyxml2::XMLUtil::StringEqual(char *p,char *q,int nChar)

{
  int iVar1;
  
  if (p != q) {
    iVar1 = strncmp(p,q,(long)nChar);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

inline static bool StringEqual(const char* p, const char* q, int nChar = INT_MAX)
    {
        if (p == q) {
            return true;
        }
        TIXMLASSERT(p);
        TIXMLASSERT(q);
        TIXMLASSERT(nChar >= 0);
        return strncmp(p, q, nChar) == 0;
    }